

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorOr.h
# Opt level: O2

void __thiscall
llvm::ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
moveConstruct<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
          (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
           *this,ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                 *Other)

{
  error_code *peVar1;
  storage_type *psVar2;
  storage_type *psVar3;
  error_code eVar4;
  
  if ((Other->field_0x10 & 1) == 0) {
    this[0x10] = (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                  )((byte)this[0x10] & 0xfe);
    psVar2 = ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
             ::getStorage((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                           *)this);
    psVar3 = ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
             ::getStorage(Other);
    (psVar2->_M_t).
    super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
    super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
    super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl =
         (psVar3->_M_t).
         super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
         super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
         super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
    (psVar3->_M_t).
    super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
    super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
    super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl = (MemoryBuffer *)0x0;
  }
  else {
    this[0x10] = (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                  )((byte)this[0x10] | 1);
    peVar1 = ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
             ::getErrorStorage((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                                *)this);
    eVar4 = ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
            ::getError(Other);
    peVar1->_M_value = eVar4._M_value;
    peVar1->_M_cat = eVar4._M_cat;
  }
  return;
}

Assistant:

void moveConstruct(ErrorOr<OtherT> &&Other) {
    if (!Other.HasError) {
      // Get the other value.
      HasError = false;
      new (getStorage()) storage_type(std::move(*Other.getStorage()));
    } else {
      // Get other's error.
      HasError = true;
      new (getErrorStorage()) std::error_code(Other.getError());
    }
  }